

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O3

int uv__async_start(uv_loop_t *loop)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int pipefd [2];
  char buf [32];
  uint local_40;
  uint local_3c;
  char local_38 [32];
  
  if ((loop->async_io_watcher).fd != -1) {
    return 0;
  }
  if (uv__async_eventfd_no_eventfd2 == '\0') {
    uVar1 = uv__eventfd2(0,0x80800);
    if (uVar1 == 0xffffffff) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      if (iVar2 == 0x26) {
        uv__async_eventfd_no_eventfd2 = '\x01';
        goto LAB_0010bb6e;
      }
LAB_0010bbe0:
      uVar1 = -iVar2;
    }
LAB_0010bbe2:
    if (-1 < (int)uVar1) {
      local_3c = 0xffffffff;
      local_40 = uVar1;
      goto LAB_0010bc65;
    }
    if (uVar1 != 0xffffffda) {
      return uVar1;
    }
  }
  else {
LAB_0010bb6e:
    if (uv__async_eventfd_no_eventfd == '\0') {
      uVar1 = uv__eventfd(0);
      if (uVar1 != 0xffffffff) {
        uv__cloexec_ioctl(uVar1,1);
        uv__nonblock_ioctl(uVar1,1);
        goto LAB_0010bbe2;
      }
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      if (iVar2 != 0x26) goto LAB_0010bbe0;
      uv__async_eventfd_no_eventfd = '\x01';
    }
  }
  iVar2 = uv__make_pipe((int *)&local_40,0x800);
  if (iVar2 == 0) {
    snprintf(local_38,0x20,"/proc/self/fd/%d",(ulong)local_40);
    uVar1 = uv__open_cloexec(local_38,2);
    if (-1 < (int)uVar1) {
      uv__close(local_40);
      uv__close(local_3c);
      local_40 = uVar1;
      local_3c = uVar1;
    }
  }
  else if (iVar2 < 0) {
    return iVar2;
  }
LAB_0010bc65:
  uv__io_init(&loop->async_io_watcher,uv__async_io,local_40);
  uv__io_start(loop,&loop->async_io_watcher,1);
  loop->async_wfd = local_3c;
  return 0;
}

Assistant:

static int uv__async_start(uv_loop_t* loop) {
  int pipefd[2];
  int err;

  if (loop->async_io_watcher.fd != -1)
    return 0;

  err = uv__async_eventfd();
  if (err >= 0) {
    pipefd[0] = err;
    pipefd[1] = -1;
  }
  else if (err == UV_ENOSYS) {
    err = uv__make_pipe(pipefd, UV__F_NONBLOCK);
#if defined(__linux__)
    /* Save a file descriptor by opening one of the pipe descriptors as
     * read/write through the procfs.  That file descriptor can then
     * function as both ends of the pipe.
     */
    if (err == 0) {
      char buf[32];
      int fd;

      snprintf(buf, sizeof(buf), "/proc/self/fd/%d", pipefd[0]);
      fd = uv__open_cloexec(buf, O_RDWR);
      if (fd >= 0) {
        uv__close(pipefd[0]);
        uv__close(pipefd[1]);
        pipefd[0] = fd;
        pipefd[1] = fd;
      }
    }
#endif
  }

  if (err < 0)
    return err;

  uv__io_init(&loop->async_io_watcher, uv__async_io, pipefd[0]);
  uv__io_start(loop, &loop->async_io_watcher, POLLIN);
  loop->async_wfd = pipefd[1];

  return 0;
}